

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void testNoCanRep(char *data,DataType datatype,Status expStatus)

{
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  Status ret_Status;
  Status local_3c;
  StrX local_38;
  
  local_3c = st_Init;
  local_38.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (data,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (data,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pvVar1 = (void *)xercesc_4_0::XSValue::getCanonicalRepresentation
                             (local_38.fUnicodeForm,datatype,&local_3c,ver_10,true,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_38);
  if (pvVar1 == (void *)0x0) {
    if (local_3c == expStatus) {
      return;
    }
    pcVar2 = "st_UnknownType";
    pcVar3 = "st_UnknownType";
    if (local_3c < (st_UnknownType|st_NoContent)) {
      pcVar3 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_3c];
    }
    if (expStatus < (st_UnknownType|st_NoContent)) {
      pcVar2 = (&PTR_anon_var_dwarf_11d7_00142bc8)[expStatus];
    }
    printf("testNoCanRep fails, data=<%s> retStatus=<%s> expStatus=<%s>\n",data,pcVar3,pcVar2);
  }
  else {
    printf("testNoCanRep fails, data=<%s>\n",data);
    operator_delete(pvVar1,2);
  }
  errSeen = 1;
  return;
}

Assistant:

void  testNoCanRep(const char*                  const  data
                 , const XSValue::DataType             datatype
                 , const XSValue::Status               expStatus)
{
    XSValue::Status ret_Status = XSValue::st_Init;
    XMLCh* canRep = XSValue::getCanonicalRepresentation(StrX(data).unicodeForm(), datatype, ret_Status);

    if (canRep)
    {
        printf("testNoCanRep fails, data=<%s>\n", data);
        delete canRep;
        errSeen=true;
        return;
    }

    if (ret_Status != expStatus)
    {
        printf("testNoCanRep fails, data=<%s> retStatus=<%s> expStatus=<%s>\n",
                data
              , getStatusString(ret_Status)
              , getStatusString(expStatus));
        errSeen=true;
    }
}